

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::emplace<QXdgDBusImageStruct_const&>
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,QXdgDBusImageStruct *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QXdgDBusImageStruct> *in_RSI;
  QArrayDataPointer<QXdgDBusImageStruct> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QXdgDBusImageStruct tmp;
  QXdgDBusImageStruct *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff94;
  byte bVar6;
  GrowthPosition where;
  Inserter local_50;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QXdgDBusImageStruct>::needsDetach
                    ((QArrayDataPointer<QXdgDBusImageStruct> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QXdgDBusImageStruct> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QXdgDBusImageStruct>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QXdgDBusImageStruct>::end
                ((QArrayDataPointer<QXdgDBusImageStruct> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      QXdgDBusImageStruct::QXdgDBusImageStruct
                ((QXdgDBusImageStruct *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00b37af4;
    }
    if ((in_RSI == (QArrayDataPointer<QXdgDBusImageStruct> *)0x0) &&
       (qVar3 = QArrayDataPointer<QXdgDBusImageStruct>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QXdgDBusImageStruct>::begin
                ((QArrayDataPointer<QXdgDBusImageStruct> *)0xb379aa);
      QXdgDBusImageStruct::QXdgDBusImageStruct
                ((QXdgDBusImageStruct *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00b37af4;
    }
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QXdgDBusImageStruct::QXdgDBusImageStruct
            ((QXdgDBusImageStruct *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QXdgDBusImageStruct> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
             (QXdgDBusImageStruct **)in_RDI,
             (QArrayDataPointer<QXdgDBusImageStruct> *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff80),
                       (qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    Inserter::~Inserter(&local_50);
  }
  else {
    QArrayDataPointer<QXdgDBusImageStruct>::begin
              ((QArrayDataPointer<QXdgDBusImageStruct> *)0xb37a88);
    QXdgDBusImageStruct::QXdgDBusImageStruct
              ((QXdgDBusImageStruct *)CONCAT17(uVar5,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QXdgDBusImageStruct::~QXdgDBusImageStruct((QXdgDBusImageStruct *)0xb37af4);
LAB_00b37af4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }